

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O3

Status __thiscall
osqp::OsqpSolver::Init(OsqpSolver *this,OsqpInstance *instance,OsqpSettings *settings)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  ulong uVar4;
  OsqpSettings *in_RCX;
  char *pcVar5;
  int left_value;
  string_view left_name;
  string_view left_name_00;
  string_view left_name_01;
  string_view left_name_02;
  string_view left_name_03;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view right_name;
  string_view right_name_00;
  string_view right_name_01;
  string_view right_name_02;
  string_view right_name_03;
  OSQPWorkspace *workspace;
  VectorXd clipped_upper_bounds;
  VectorXd clipped_lower_bounds;
  SparseMatrix<double,_0,_long_long> objective_matrix_upper_triangle;
  OSQPData data;
  OSQPSettings osqp_settings;
  OSQPWorkspace *local_1f8;
  c_float *local_1f0 [2];
  c_float *local_1e0 [2];
  SparseMatrix<double,_0,_long_long> local_1d0;
  OSQPData local_188;
  OSQPSettings local_150;
  undefined1 local_a0 [48];
  c_int local_70;
  undefined1 local_68 [48];
  undefined8 local_38;
  
  if (settings->adaptive_rho_interval != 0) {
    pcVar5 = (char *)0x3c;
LAB_00167259:
    message._M_str = pcVar5;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
    return (Status)this;
  }
  if (settings->polish_refine_iter != 0) {
    pcVar5 = (char *)0x3d;
    goto LAB_00167259;
  }
  dVar2 = settings->alpha;
  dVar3 = settings->delta;
  left_name._M_len = (ulong)dVar2 & 0xffffffff;
  left_name._M_str = (char *)0x20;
  right_name._M_str = (char *)0xd;
  right_name._M_len = (size_t)"instance.objective_matrix.cols()";
  left_value = (int)this;
  anon_unknown_6::CheckDimensions(left_value,*(int *)&settings->sigma,left_name,right_name);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  left_name_00._M_len = (ulong)dVar2 & 0xffffffff;
  left_name_00._M_str = (char *)0x20;
  right_name_00._M_str = (char *)0xd;
  right_name_00._M_len = (size_t)"instance.objective_matrix.rows()";
  anon_unknown_6::CheckDimensions(left_value,(int)settings->scaling,left_name_00,right_name_00);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  left_name_01._M_len = (ulong)dVar2 & 0xffffffff;
  left_name_01._M_str = (char *)0x20;
  right_name_01._M_str = (char *)0xd;
  right_name_01._M_len = (size_t)"instance.objective_vector.size()";
  anon_unknown_6::CheckDimensions
            (left_value,*(int *)&settings->eps_prim_inf,left_name_01,right_name_01);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  left_name_02._M_str = (char *)0x1c;
  left_name_02._M_len = (size_t)dVar3;
  right_name_02._M_str = (char *)0xf;
  right_name_02._M_len = (size_t)"instance.lower_bounds.size()";
  anon_unknown_6::CheckDimensions(left_value,*(int *)&settings[1].sigma,left_name_02,right_name_02);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  left_name_03._M_str = (char *)0x1c;
  left_name_03._M_len = (size_t)dVar3;
  right_name_03._M_str = (char *)0xf;
  right_name_03._M_len = (size_t)"instance.upper_bounds.size()";
  anon_unknown_6::CheckDimensions
            (left_value,*(int *)&settings[1].adaptive_rho,left_name_03,right_name_03);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  if ((long)settings[1].sigma < 0) {
LAB_001675ea:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_150.rho = (c_float)(settings + 1);
  local_150.adaptive_rho = -0x39d6c1a6c65f7316;
  local_150.sigma = settings[1].sigma;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1e0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_150);
  if ((long)*(c_float *)&settings[1].adaptive_rho < 0) goto LAB_001675ea;
  local_150.rho = (c_float)&settings[1].scaling;
  local_150.adaptive_rho = 0x46293e5939a08cea;
  local_150.sigma = *(c_float *)&settings[1].adaptive_rho;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1f0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_150);
  local_150.rho = (c_float)((ulong)local_150.rho & 0xffffffffffffff00);
  local_188.n = (c_int)dVar2;
  local_188.m = (c_int)dVar3;
  local_150.sigma = (c_float)settings;
  Eigen::SparseMatrix<double,0,long_long>::
  SparseMatrix<Eigen::TriangularView<Eigen::SparseMatrix<double,0,long_long>const,2u>>
            ((SparseMatrix<double,0,long_long> *)&local_1d0,
             (SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
              *)&local_150);
  local_68._0_8_ = local_1d0.m_outerIndex[(long)dVar2];
  local_188.P = (csc *)local_68;
  local_68._24_8_ = local_1d0.m_outerIndex;
  local_68._32_8_ = local_1d0.m_data.m_indices;
  local_68._40_4_ = (int)local_1d0.m_data.m_values;
  local_68._44_4_ = local_1d0.m_data.m_values._4_4_;
  local_38 = 0xffffffffffffffff;
  local_a0._24_8_ = *(undefined8 *)&settings->polish;
  local_a0._0_8_ = *(c_int *)(local_a0._24_8_ + dVar2 * 8);
  local_188.A = (csc *)local_a0;
  auVar1[0] = settings->verbose;
  auVar1[1] = settings->scaled_termination;
  auVar1._2_6_ = *(undefined6 *)&settings->field_0x82;
  auVar1._8_8_ = settings->check_termination;
  local_a0._40_4_ = auVar1._0_4_;
  local_a0._32_8_ = auVar1._8_8_;
  local_a0._44_4_ = (int)((uint6)auVar1._2_6_ >> 0x10);
  local_70 = -1;
  local_188.q = (c_float *)settings->eps_rel;
  local_188.l = local_1e0[0];
  local_188.u = local_1f0[0];
  local_a0._8_8_ = dVar3;
  local_a0._16_8_ = dVar2;
  local_68._8_8_ = dVar2;
  local_68._16_8_ = dVar2;
  anon_unknown_6::ToInternalSettings(&local_150,in_RCX);
  local_1f8 = (OSQPWorkspace *)0x0;
  uVar4 = osqp_setup(&local_1f8,&local_188,&local_150);
  std::__uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::reset
            ((__uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)instance,
             (pointer)local_1f8);
  switch(uVar4 & 0xffffffff) {
  case 0:
    (this->workspace_)._M_t.
    super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
    super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
    super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
         (OSQPWorkspaceHelper *)0x1;
    goto LAB_001675c7;
  case 1:
    pcVar5 = (char *)0x31;
    goto LAB_001675a0;
  case 2:
    pcVar5 = (char *)0x2c;
    goto LAB_001675a0;
  case 3:
    pcVar5 = (char *)0x38;
    break;
  case 4:
    pcVar5 = (char *)0x3e;
    break;
  case 5:
    pcVar5 = (char *)0x3a;
LAB_001675a0:
    message_00._M_str = pcVar5;
    message_00._M_len = (size_t)this;
    absl::InvalidArgumentError(message_00);
    goto LAB_001675c7;
  case 6:
  default:
    pcVar5 = (char *)0x33;
    break;
  case 7:
    pcVar5 = (char *)0x35;
  }
  message_01._M_str = pcVar5;
  message_01._M_len = (size_t)this;
  absl::UnknownError(message_01);
LAB_001675c7:
  Eigen::SparseMatrix<double,_0,_long_long>::~SparseMatrix(&local_1d0);
  free(local_1f0[0]);
  free(local_1e0[0]);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::Init(const OsqpInstance& instance,
                              const OsqpSettings& settings) {
  if (!instance.objective_matrix.isCompressed()) {
    return absl::InvalidArgumentError(
        "objective_matrix must be compressed (call makeCompressed()).");
  }
  if (!instance.constraint_matrix.isCompressed()) {
    return absl::InvalidArgumentError(
        "constraint_matrix must be compressed (call makeCompressed()).");
  }
  const c_int num_variables = instance.num_variables();
  const c_int num_constraints = instance.num_constraints();

  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_matrix.cols(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_matrix.rows(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_vector.size(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.lower_bounds.size(), num_constraints));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.upper_bounds.size(), num_constraints));

  // Clip bounds using OSQP_INFTY. Failing to do this causes subtle convergence
  // issues instead of producing explicit errors (e.g., the
  // DetectsPrimalInfeasible test fails). The osqp-python interface also clips
  // the bounds in the same way.
  VectorXd clipped_lower_bounds = instance.lower_bounds.cwiseMax(-OSQP_INFTY);
  VectorXd clipped_upper_bounds = instance.upper_bounds.cwiseMin(OSQP_INFTY);

  // OSQP copies all the data, so it's okay to discard this struct after
  // osqp_setup. It also does not modify the input data (note osqp_setup takes a
  // const OSQPData*). const_cast is needed here to fill in the input data
  // structures.
  OSQPData data;
  data.n = num_variables;
  data.m = num_constraints;

  // TODO(ml): This copy could be avoided if the matrix is already upper
  // triangular.
  Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>
      objective_matrix_upper_triangle =
          instance.objective_matrix.triangularView<Eigen::Upper>();

  // OSQP's csc struct represents sparse matrices in compressed sparse column
  // (CSC) format and (confusingly) triplet format. osqp_setup() assumes the
  // input is provided in CSC format. The mapping from Eigen::SparseMatrix's
  // outerIndexPtr(), innerIndexPtr(), and valuePtr() is direct because we
  // require the sparse matrices to be compressed and follow the Eigen::ColMajor
  // storage scheme. For further background, see
  // https://eigen.tuxfamily.org/dox/group__TutorialSparse.html for the
  // description of CSC format in Eigen and osqp/include/types.h for the
  // definition of OSQP's csc struct.
  ::csc objective_matrix = {
      objective_matrix_upper_triangle.outerIndexPtr()[num_variables],
      num_variables,
      num_variables,
      const_cast<c_int*>(objective_matrix_upper_triangle.outerIndexPtr()),
      const_cast<c_int*>(objective_matrix_upper_triangle.innerIndexPtr()),
      const_cast<double*>(objective_matrix_upper_triangle.valuePtr()),
      -1};
  data.P = &objective_matrix;

  ::csc constraint_matrix = {
      instance.constraint_matrix.outerIndexPtr()[num_variables],
      num_constraints,
      num_variables,
      const_cast<c_int*>(instance.constraint_matrix.outerIndexPtr()),
      const_cast<c_int*>(instance.constraint_matrix.innerIndexPtr()),
      const_cast<double*>(instance.constraint_matrix.valuePtr()),
      -1};
  data.A = &constraint_matrix;

  data.q = const_cast<double*>(instance.objective_vector.data());
  data.l = clipped_lower_bounds.data();
  data.u = clipped_upper_bounds.data();

  ::OSQPSettings osqp_settings = ToInternalSettings(settings);

  OSQPWorkspace* workspace = nullptr;
  const int return_code = osqp_setup(&workspace, &data, &osqp_settings);
  workspace_.reset(static_cast<OSQPWorkspaceHelper*>(workspace));
  if (return_code == 0) {
    return absl::OkStatus();
  }
  switch (static_cast<osqp_error_type>(return_code)) {
    case OSQP_DATA_VALIDATION_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: data validation error.");
    case OSQP_SETTINGS_VALIDATION_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: invalid settings.");
    case OSQP_LINSYS_SOLVER_LOAD_ERROR:
      // This should never happen because qdldl is statically linked in.
      return absl::UnknownError(
          "Unable to initialize OSQP: unable to load linear solver.");
    case OSQP_LINSYS_SOLVER_INIT_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: unable to initialize linear solver.");
    case OSQP_NONCVX_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: the problem appears non-convex.");
    case OSQP_MEM_ALLOC_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: memory allocation error.");
    case OSQP_WORKSPACE_NOT_INIT_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: workspace not initialized.");
  }
  return absl::UnknownError(
      "Unable to initialize OSQP: unrecognized error code.");
}